

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall PClassActor::SetDamageFactor(PClassActor *this,FName *type,double factor)

{
  TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this_00;
  double factor_local;
  FName local_1c;
  
  this_00 = &this->DamageFactors->
             super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>;
  factor_local = factor;
  if (this_00 == (TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)0x0) {
    this_00 = (TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)operator_new(0x18);
    TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::TMap(this_00);
    this->DamageFactors = (DmgFactors *)this_00;
  }
  local_1c = (FName)type->Index;
  TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::Insert
            (this_00,&local_1c,&factor_local);
  return;
}

Assistant:

void PClassActor::SetDamageFactor(FName type, double factor)
{
	if (DamageFactors == NULL)
	{
		DamageFactors = new DmgFactors;
	}
	DamageFactors->Insert(type, factor);
}